

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O1

cx_string<100UL> * __thiscall
mserialize::cx_strcat<1ul,1ul,22ul,17ul,6ul,4ul,7ul,1ul,7ul,3ul,8ul,16ul,6ul,1ul>
          (cx_string<100UL> *__return_storage_ptr__,mserialize *this,cx_string<1UL> *strings,
          cx_string<1UL> *strings_1,cx_string<22UL> *strings_2,cx_string<17UL> *strings_3,
          cx_string<6UL> *strings_4,cx_string<4UL> *strings_5,cx_string<7UL> *strings_6,
          cx_string<1UL> *strings_7,cx_string<7UL> *strings_8,cx_string<3UL> *strings_9,
          cx_string<8UL> *strings_10,cx_string<16UL> *strings_11,cx_string<6UL> *strings_12,
          cx_string<1UL> *strings_13)

{
  undefined8 *puVar1;
  long lVar2;
  ulong uVar3;
  char *data [15];
  char buffer [101];
  ulong local_178 [16];
  char *local_f8;
  mserialize *local_f0;
  cx_string<1UL> *local_e8;
  cx_string<1UL> *local_e0;
  cx_string<22UL> *local_d8;
  cx_string<17UL> *local_d0;
  cx_string<6UL> *local_c8;
  cx_string<4UL> *pcStack_c0;
  cx_string<7UL> *local_b8;
  cx_string<1UL> *pcStack_b0;
  cx_string<7UL> *local_a8;
  cx_string<3UL> *pcStack_a0;
  cx_string<8UL> *local_98;
  cx_string<16UL> *pcStack_90;
  cx_string<6UL> *local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined5 uStack_20;
  undefined3 uStack_1b;
  undefined5 uStack_18;
  
  puVar1 = &local_78;
  uStack_18 = 0;
  local_28 = 0;
  uStack_20 = 0;
  uStack_1b = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_f8 = "";
  local_f0 = this;
  local_e8 = strings;
  local_e0 = strings_1;
  local_d8 = strings_2;
  local_d0 = strings_3;
  local_c8 = strings_4;
  pcStack_c0 = strings_5;
  local_b8 = strings_6;
  pcStack_b0 = strings_7;
  local_a8 = strings_8;
  pcStack_a0 = strings_9;
  local_98 = strings_10;
  pcStack_90 = strings_11;
  local_88 = strings_12;
  local_178[0] = 0;
  lVar2 = 1;
  local_178[1] = 1;
  local_178[2] = 1;
  local_178[3] = 0x16;
  local_178[4] = 0x11;
  local_178[5] = 6;
  local_178[6] = 4;
  local_178[7] = 7;
  local_178[8] = 1;
  local_178[9] = 7;
  local_178[10] = 3;
  local_178[0xb] = 8;
  local_178[0xc] = 0x10;
  local_178[0xd] = 6;
  local_178[0xe] = 1;
  do {
    if (local_178[lVar2] != 0) {
      uVar3 = 0;
      do {
        *(char *)((long)puVar1 + uVar3) = (&local_f8)[lVar2][uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar3 < local_178[lVar2]);
      puVar1 = (undefined8 *)((long)puVar1 + uVar3);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xf);
  __return_storage_ptr__->_data[100] = '\0';
  memcpy(__return_storage_ptr__,&local_78,100);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}